

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O0

void llvm::MD5::stringifyResult(MD5Result *Result,SmallString<32U> *Str)

{
  SmallString<32U> local_48;
  SmallString<32U> *local_18;
  SmallString<32U> *Str_local;
  MD5Result *Result_local;
  
  local_18 = Str;
  Str_local = (SmallString<32U> *)Result;
  MD5Result::digest(&local_48,Result);
  SmallString<32U>::operator=(local_18,&local_48);
  SmallString<32U>::~SmallString(&local_48);
  return;
}

Assistant:

void MD5::stringifyResult(MD5Result &Result, SmallString<32> &Str) {
  Str = Result.digest();
}